

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BufferVkImpl::BufferVkImpl
          (BufferVkImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *BuffViewObjMemAllocator,RenderDeviceVkImpl *pRenderDeviceVk,
          BufferDesc *BuffDesc,BufferData *pBuffData)

{
  BufferDesc *Desc;
  MEMORY_PROPERTIES *pMVar1;
  USAGE UVar2;
  VulkanPhysicalDevice *this_00;
  VulkanLogicalDevice *this_01;
  unsigned_long alignment;
  VkDeviceMemory memory;
  void *pvVar3;
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *this_02;
  long lVar4;
  bool bVar5;
  BufferData *pBVar6;
  byte bVar7;
  BIND_FLAGS BVar8;
  uint uVar9;
  uint32_t MemoryTypeIndex;
  VkResult VVar10;
  VkPipelineStageFlags VVar11;
  RenderDeviceVkImpl *pRVar12;
  VkDeviceSize memoryOffset;
  VkDeviceAddress VVar13;
  type memoryOffset_00;
  uint uVar14;
  ulong uVar15;
  char (*Args_1) [56];
  char (*Args_1_00) [128];
  char (*Args_1_01) [44];
  VkMemoryPropertyFlags requiredProperties;
  BIND_FLAGS BVar16;
  RESOURCE_STATE RVar17;
  SoftwareQueueIndex CmdQueueInd;
  VkBufferCreateInfo local_248;
  RenderDeviceVkImpl *local_210;
  string msg;
  _Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_188;
  VkDeviceSize *local_168;
  BufferData *local_160;
  VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *local_158;
  VulkanMemoryAllocation StagingMemoryAllocation;
  VkMemoryRequirements MemReqs;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  BufferWrapper StagingBuffer;
  VkMemoryRequirements StagingBufferMemReqs;
  string StagingBufferName;
  CommandPoolWrapper CmdPool;
  string msg_11;
  VkBufferCreateInfo VkStaginBuffCI;
  
  BufferBase<Diligent::EngineVkImplTraits>::BufferBase
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,pRefCounters,
             BuffViewObjMemAllocator,pRenderDeviceVk,BuffDesc,false);
  (this->super_BufferBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>.
  super_ObjectBase<Diligent::IBufferVk>.super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
  super_IBuffer.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00891240;
  this->m_DynamicOffsetAlignment = 0;
  local_158 = &this->m_VulkanBuffer;
  Desc = &(this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc;
  this->m_BufferMemoryAlignedOffset = 0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanBuffer).m_VkObject = (VkBuffer_T *)0x0;
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  local_160 = pBuffData;
  ValidateBufferInitData(Desc,pBuffData);
  local_168 = &this->m_BufferMemoryAlignedOffset;
  this_00 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_01 = (pRenderDeviceVk->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  uVar9 = *(uint *)((long)&(this_00->m_Properties).limits + 0x1e0);
  uVar14 = 4;
  if (4 < uVar9) {
    uVar14 = uVar9;
  }
  this->m_DynamicOffsetAlignment = uVar14;
  local_248.pNext = (void *)0x0;
  local_248.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_248.queueFamilyIndexCount = 0;
  local_248._44_4_ = 0;
  local_248.pQueueFamilyIndices = (uint32_t *)0x0;
  local_248.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_248._4_4_ = 0;
  local_248.flags = 0;
  local_248._20_4_ = 0;
  local_248.size =
       (this->super_BufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
       .m_Desc.Size;
  local_248.usage._0_1_ = 3;
  local_248.usage._1_1_ = 0;
  local_248.usage._2_2_ = 0;
  BVar16 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_Desc.BindFlags;
  local_210 = pRenderDeviceVk;
LAB_001a3f5b:
  if (BVar16 != BIND_NONE) {
    BVar8 = -BVar16 & BVar16;
    BVar16 = BVar16 ^ BVar8;
    switch(BVar8) {
    case BIND_VERTEX_BUFFER:
      local_248.usage._0_1_ = (byte)local_248.usage | 0x80;
      goto LAB_001a3f5b;
    case BIND_INDEX_BUFFER:
      local_248.usage._0_1_ = (byte)local_248.usage | 0x40;
      goto LAB_001a3f5b;
    case BIND_INDEX_BUFFER|BIND_VERTEX_BUFFER:
    case BIND_UNIFORM_BUFFER|BIND_VERTEX_BUFFER:
    case BIND_UNIFORM_BUFFER|BIND_INDEX_BUFFER:
    case BIND_UNIFORM_BUFFER|BIND_INDEX_BUFFER|BIND_VERTEX_BUFFER:
switchD_001a3f7e_caseD_3:
      FormatString<char[32]>(&msg,(char (*) [32])"unsupported buffer binding type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x97);
      std::__cxx11::string::~string((string *)&msg);
      goto LAB_001a3f5b;
    case BIND_UNIFORM_BUFFER:
      local_248.usage._0_1_ = (byte)local_248.usage | 0x10;
      uVar9 = *(uint *)((long)&(this_00->m_Properties).limits + 0x140);
      break;
    case BIND_SHADER_RESOURCE:
      uVar9 = CONCAT22(local_248.usage._2_2_,CONCAT11(local_248.usage._1_1_,(byte)local_248.usage));
      if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Mode == BUFFER_MODE_FORMATTED) {
        uVar9 = uVar9 | 4;
LAB_001a4013:
        local_248.usage._0_1_ = (byte)uVar9;
        local_248.usage._1_1_ = (byte)(uVar9 >> 8);
        local_248.usage._2_2_ = (ushort)(uVar9 >> 0x10);
        uVar9 = *(uint *)((long)&(this_00->m_Properties).limits + 0x138);
      }
      else {
LAB_001a4024:
        local_248.usage._0_1_ = (byte)uVar9 | 0x20;
        local_248.usage._1_1_ = (byte)(uVar9 >> 8);
        local_248.usage._2_2_ = (ushort)(uVar9 >> 0x10);
        uVar9 = *(uint *)((long)&(this_00->m_Properties).limits + 0x148);
      }
      break;
    default:
      if (BVar8 == BIND_UNORDERED_ACCESS) {
        uVar9 = CONCAT22(local_248.usage._2_2_,CONCAT11(local_248.usage._1_1_,(byte)local_248.usage)
                        );
        if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.Mode == BUFFER_MODE_FORMATTED) {
          uVar9 = uVar9 | 8;
          goto LAB_001a4013;
        }
        goto LAB_001a4024;
      }
      if (BVar8 == BIND_INDIRECT_DRAW_ARGS) {
        local_248.usage._1_1_ = local_248.usage._1_1_ | 1;
      }
      else {
        if (BVar8 != BIND_RAY_TRACING) goto switchD_001a3f7e_caseD_3;
        uVar9 = CONCAT22(local_248.usage._2_2_,CONCAT11(local_248.usage._1_1_,(byte)local_248.usage)
                        ) | 0xa0420;
        local_248.usage._0_1_ = (byte)uVar9;
        local_248.usage._1_1_ = (byte)(uVar9 >> 8);
        local_248.usage._2_2_ = (ushort)(uVar9 >> 0x10);
      }
      goto LAB_001a3f5b;
    }
    if (uVar9 < this->m_DynamicOffsetAlignment) {
      uVar9 = this->m_DynamicOffsetAlignment;
    }
    this->m_DynamicOffsetAlignment = uVar9;
    goto LAB_001a3f5b;
  }
  local_248.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_248.queueFamilyIndexCount = 0;
  local_248.pQueueFamilyIndices = (uint32_t *)0x0;
  uVar15 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_Desc.ImmediateContextMask;
  if ((uVar15 & uVar15 - 1) == 0) {
    local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118._M_impl.super__Vector_impl_data._M_start = (uint32_t *)0x0;
    local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    pRVar12 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           *)this);
    RenderDeviceVkImpl::ConvertCmdQueueIdsToQueueFamilies
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118,pRVar12,
               (this->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.ImmediateContextMask);
  }
  uVar15 = (long)local_118._M_impl.super__Vector_impl_data._M_finish -
           (long)local_118._M_impl.super__Vector_impl_data._M_start >> 2;
  if (1 < uVar15) {
    local_248.sharingMode = VK_SHARING_MODE_CONCURRENT;
    local_248.queueFamilyIndexCount = (uint32_t)uVar15;
    local_248.pQueueFamilyIndices = local_118._M_impl.super__Vector_impl_data._M_start;
  }
  bVar7 = 1;
  if ((CONCAT22(local_248.usage._2_2_,CONCAT11(local_248.usage._1_1_,(byte)local_248.usage)) &
      0x2000c) == 0) {
    if (((byte)local_248.usage & 0x20) == 0) {
      bVar7 = 0;
    }
    else {
      bVar7 = (byte)(char)(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          .m_Desc.BindFlags >> 7;
    }
  }
  UVar2 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Usage;
  Args_1 = (char (*) [56])(ulong)UVar2;
  if (UVar2 == USAGE_DYNAMIC) {
    if (bVar7 == 0) {
      if (local_248.sharingMode != VK_SHARING_MODE_EXCLUSIVE) {
        FormatString<char[91]>
                  (&msg,(char (*) [91])
                        "Sharing mode is not supported for dynamic buffers, must be handled by ValidateBufferDesc()"
                  );
        Args_1 = (char (*) [56])0xc5;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0xc5);
        std::__cxx11::string::~string((string *)&msg);
      }
      (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_GENERIC_READ;
      VVar11 = ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE_GENERIC_READ);
      if (VVar11 != 0x82f) {
        FormatString<char[26],char[56]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ResourceStateFlagsToVkAccessFlags(State) == AccessFlags",Args_1);
        Args_1 = (char (*) [56])0xdb;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0xdb);
        std::__cxx11::string::~string((string *)&msg);
      }
      (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties =
           MEMORY_PROPERTY_HOST_COHERENT;
      if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State == RESOURCE_STATE_UNKNOWN)
      {
        FormatString<char[26],char[17]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"IsInKnownState()",
                   (char (*) [17])Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0x1bd);
        std::__cxx11::string::~string((string *)&msg);
      }
      goto LAB_001a4cc7;
    }
    uVar15 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_Desc.ImmediateContextMask;
    if ((uVar15 & uVar15 - 1) != 0) {
      FormatString<char[108]>
                (&msg,(char (*) [108])
                      "ImmediateContextMask must contain single set bit, this error should\'ve been handled in ValidateBufferDesc()"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0xe4);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  else if (UVar2 == USAGE_SPARSE) {
    local_248.flags =
         ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.MiscFlags & 1) * 4 + 3;
    VulkanUtilities::VulkanLogicalDevice::CreateBuffer
              ((BufferWrapper *)&msg,this_01,&local_248,
               (this->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
    operator=(local_158,
              (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)&msg);
    VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
    ~VulkanObjectWrapper
              ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)&msg);
    (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_UNDEFINED;
    goto LAB_001a4cc7;
  }
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&msg,this_01,&local_248,(Desc->super_DeviceObjectAttribs).Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(local_158,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)&msg);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)&msg);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&MemReqs,this_01,(this->m_VulkanBuffer).m_VkObject);
  UVar2 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Usage;
  if (UVar2 < USAGE_STAGING) {
    requiredProperties = 1;
LAB_001a4373:
    MemoryTypeIndex =
         VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                   (this_00,MemReqs.memoryTypeBits,requiredProperties);
  }
  else {
    if (1 < UVar2 - 3) {
      FormatString<char[17]>(&msg,(char (*) [17])"Unexpected usage");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x10c);
      std::__cxx11::string::~string((string *)&msg);
      requiredProperties = 0;
      goto LAB_001a4373;
    }
    uVar9 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.CPUAccessFlags & 1;
    requiredProperties = (uint)(UVar2 == USAGE_UNIFIED) + uVar9 * 8 + 6;
    MemoryTypeIndex =
         VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                   (this_00,MemReqs.memoryTypeBits,requiredProperties);
    if (MemoryTypeIndex == 0xffffffff) {
      requiredProperties = (uint)(UVar2 == USAGE_UNIFIED) + uVar9 * 8 + 2;
      goto LAB_001a4373;
    }
  }
  pRVar12 = local_210;
  if ((requiredProperties & 4) != 0) {
    pMVar1 = &(this->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties;
    *(undefined1 *)pMVar1 = (char)*pMVar1 | MEMORY_PROPERTY_HOST_COHERENT;
  }
  uVar9 = (uint)local_248.usage._2_2_;
  if (MemoryTypeIndex == 0xffffffff) {
    msg._M_dataplus._M_p._0_1_ = 0x27;
    LogError<true,char[49],char_const*,char>
              (false,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x11a,(char (*) [49])"Failed to find suitable memory type for buffer \'",
               (char **)Desc,(char *)&msg);
  }
  uVar15 = MemReqs.alignment;
  if (((this->super_BufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
       .m_Desc.BindFlags & BIND_RAY_TRACING) != BIND_NONE) {
    uVar14 = *(uint32_t *)((long)&(this_00->m_ExtProperties).AccelStruct + 0x38);
    uVar15 = (ulong)uVar14;
    if (uVar14 < 0x11) {
      uVar15 = 0x10;
    }
    if (uVar15 < MemReqs.alignment) {
      uVar15 = MemReqs.alignment;
    }
    if (uVar15 % MemReqs.alignment != 0) {
      FormatString<char[26],char[43]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"RequiredAlignment % MemReqs.alignment == 0",
                 (char (*) [43])MemReqs.alignment);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x126);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  if ((((this->super_BufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
        .m_Desc.CPUAccessFlags & (CPU_ACCESS_FLAG_LAST|CPU_ACCESS_READ)) == CPU_ACCESS_NONE) ||
     (((this->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties &
      MEMORY_PROPERTY_HOST_COHERENT) != MEMORY_PROPERTY_UNKNOWN)) {
    bVar5 = false;
  }
  else {
    alignment = *(VkDeviceSize *)((long)&(this_00->m_Properties).limits + 0x1f0);
    MemReqs.size = AlignUp<unsigned_long,unsigned_long>(MemReqs.size,alignment);
    if (uVar15 <= alignment) {
      uVar15 = alignment;
    }
    bVar5 = true;
  }
  if ((uVar15 ^ uVar15 - 1) <= uVar15 - 1) {
    FormatString<char[29]>(&msg,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x135);
    std::__cxx11::string::~string((string *)&msg);
  }
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)&msg,pRVar12,MemReqs.size,uVar15,MemoryTypeIndex,uVar9 & 2);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)msg._M_dataplus._M_p;
  (this->m_MemoryAllocation).UnalignedOffset = msg._M_string_length;
  (this->m_MemoryAllocation).Size = msg.field_2._M_allocated_capacity;
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length = 0;
  msg.field_2._M_allocated_capacity = 0;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&msg);
  if ((this->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    LogError<true,char[39],char_const*,char[3]>
              (false,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x138,(char (*) [39])"Failed to allocate memory for buffer \'",(char **)Desc,
               (char (*) [3])"\'.");
  }
  memoryOffset = AlignUp<unsigned_long,unsigned_long>
                           ((this->m_MemoryAllocation).UnalignedOffset,uVar15);
  this->m_BufferMemoryAlignedOffset = memoryOffset;
  if ((this->m_MemoryAllocation).Size <
      (MemReqs.size + memoryOffset) - (this->m_MemoryAllocation).UnalignedOffset) {
    FormatString<char[39]>(&msg,(char (*) [39])"Size of memory allocation is too small");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x13b);
    std::__cxx11::string::~string((string *)&msg);
    memoryOffset = *local_168;
  }
  VVar10 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                     (this_01,(this->m_VulkanBuffer).m_VkObject,
                      (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject,memoryOffset);
  if (VVar10 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
    LogError<true,char[29],char[17],char_const*>
              (false,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x13e,(char (*) [29])"Failed to bind buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)&msg);
  }
  if ((bVar5) &&
     ((MemReqs.size + *local_168) % *(VkDeviceSize *)((long)&(this_00->m_Properties).limits + 0x1f0)
      != 0)) {
    FormatString<char[35]>(&msg,(char (*) [35])"End offset is not properly aligned");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x140);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (((this->super_BufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
       .m_Desc.BindFlags & BIND_RAY_TRACING) != BIND_NONE) {
    uVar9 = *(uint32_t *)((long)&(this_00->m_ExtProperties).AccelStruct + 0x38);
    VVar13 = GetVkDeviceAddress(this);
    uVar15 = 0x10;
    if (0x10 < uVar9) {
      uVar15 = (ulong)uVar9;
    }
    if (VVar13 % uVar15 != 0) {
      FormatString<char[54]>
                (&msg,(char (*) [54])"Address is not properly aligned for ray tracing usage");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x149);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  pBVar6 = local_160;
  RVar17 = RESOURCE_STATE_UNDEFINED;
  if ((local_160 != (BufferData *)0x0) && (local_160->pData != (void *)0x0)) {
    uVar15 = local_160->DataSize;
    if (local_248.size < local_160->DataSize) {
      uVar15 = local_248.size;
    }
    if (uVar15 != 0) {
      if ((this_00->m_MemoryProperties).memoryTypeCount <= MemoryTypeIndex) {
        FormatString<char[26],char[46]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"MemoryTypeIndex < MemoryProps.memoryTypeCount",
                   (char (*) [46])(ulong)MemoryTypeIndex);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0x155);
        std::__cxx11::string::~string((string *)&msg);
      }
      uVar9 = (this_00->m_MemoryProperties).memoryTypes[MemoryTypeIndex].propertyFlags;
      if ((uVar9 & 2) == 0) {
        VkStaginBuffCI._44_4_ = local_248._44_4_;
        VkStaginBuffCI.queueFamilyIndexCount = local_248.queueFamilyIndexCount;
        VkStaginBuffCI.pQueueFamilyIndices = local_248.pQueueFamilyIndices;
        VkStaginBuffCI.flags = local_248.flags;
        VkStaginBuffCI._20_4_ = local_248._20_4_;
        VkStaginBuffCI.size = local_248.size;
        VkStaginBuffCI.sType = local_248.sType;
        VkStaginBuffCI._4_4_ = local_248._4_4_;
        VkStaginBuffCI.pNext = local_248.pNext;
        VkStaginBuffCI.sharingMode = local_248.sharingMode;
        VkStaginBuffCI.usage = 1;
        std::__cxx11::string::string
                  ((string *)&StagingBufferName,"Upload buffer for \'",(allocator *)&msg);
        std::__cxx11::string::append((char *)&StagingBufferName);
        std::__cxx11::string::push_back((char)&StagingBufferName);
        VulkanUtilities::VulkanLogicalDevice::CreateBuffer
                  (&StagingBuffer,this_01,&VkStaginBuffCI,StagingBufferName._M_dataplus._M_p);
        VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
                  (&StagingBufferMemReqs,this_01,StagingBuffer.m_VkObject);
        if ((StagingBufferMemReqs.alignment ^ StagingBufferMemReqs.alignment - 1) <=
            StagingBufferMemReqs.alignment - 1) {
          FormatString<char[29]>(&msg,(char (*) [29])"Alignment is not power of 2!");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x16f);
          std::__cxx11::string::~string((string *)&msg);
        }
        Args_1_00 = (char (*) [128])0x6;
        VulkanUtilities::VulkanMemoryManager::Allocate
                  (&StagingMemoryAllocation,&local_210->m_MemoryMgr,&StagingBufferMemReqs,6,0);
        if (StagingMemoryAllocation.Page == (VulkanMemoryPage *)0x0) {
          Args_1_00 = (char (*) [128])0x176;
          LogError<true,char[47],char_const*,char[3]>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x176,(char (*) [47])"Failed to allocate staging memory for buffer \'",
                     (char **)Desc,(char (*) [3])"\'.");
        }
        memory = ((StagingMemoryAllocation.Page)->m_VkMemory).m_VkObject;
        memoryOffset_00 =
             AlignUp<unsigned_long,unsigned_long>
                       (StagingMemoryAllocation.UnalignedOffset,StagingBufferMemReqs.alignment);
        if (StagingMemoryAllocation.Size <
            (StagingBufferMemReqs.size + memoryOffset_00) - StagingMemoryAllocation.UnalignedOffset)
        {
          FormatString<char[26],char[128]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "StagingMemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - StagingMemoryAllocation.UnalignedOffset)"
                     ,Args_1_00);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x17a);
          std::__cxx11::string::~string((string *)&msg);
        }
        pvVar3 = (StagingMemoryAllocation.Page)->m_CPUMemory;
        if (pvVar3 == (void *)0x0) {
          msg._M_dataplus._M_p._0_1_ = 0x27;
          LogError<true,char[45],char_const*,char>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x17e,(char (*) [45])"Failed to allocate staging data for buffer \'",
                     (char **)Desc,(char *)&msg);
        }
        memcpy((void *)((long)pvVar3 + memoryOffset_00),local_160->pData,uVar15);
        VVar10 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                           (this_01,StagingBuffer.m_VkObject,memory,memoryOffset_00);
        pBVar6 = local_160;
        if (VVar10 != VK_SUCCESS) {
          msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
          LogError<true,char[37],char[17],char_const*>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x182,(char (*) [37])"Failed to bind staging buffer memory",
                     (char (*) [17])"\nVK Error Code: ",(char **)&msg);
        }
        this_02 = (DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *)pBVar6->pContext;
        if (this_02 == (DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *)0x0) {
          uVar15 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   .m_Desc.ImmediateContextMask;
          if (uVar15 == 0) {
            uVar9 = 0x40;
          }
          else {
            lVar4 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar9 = (uint)lVar4;
          }
          IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>::
          IndexWrapper<unsigned_int,unsigned_int>
                    ((IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag> *)&CmdQueueInd,
                     uVar9);
        }
        else {
          CheckDynamicType<Diligent::DeviceContextVkImpl,Diligent::IDeviceContext>
                    ((IDeviceContext *)this_02);
          CmdQueueInd = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                                  (this_02);
        }
        CmdPool.m_pLogicalDevice.
        super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        CmdPool.m_pLogicalDevice.
        super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        CmdPool.m_VkObject = (VkCommandPool_T *)0x0;
        VulkanUtilities::VulkanCommandBuffer::VulkanCommandBuffer((VulkanCommandBuffer *)&msg);
        RenderDeviceVkImpl::AllocateTransientCmdPool
                  (local_210,CmdQueueInd,&CmdPool,(VulkanCommandBuffer *)&msg,
                   "Transient command pool to copy staging data to a device buffer");
        Args_1_01 = (char (*) [44])0x4000;
        VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
                  ((VulkanCommandBuffer *)&msg,0x4000,0x800,0x4000,0x1000);
        VVar11 = ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE_COPY_DEST);
        if (VVar11 != 0x1000) {
          FormatString<char[26],char[44]>
                    (&msg_11,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"AccessFlags == VK_ACCESS_TRANSFER_WRITE_BIT",Args_1_01);
          DebugAssertionFailed
                    (msg_11._M_dataplus._M_p,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,399);
          std::__cxx11::string::~string((string *)&msg_11);
        }
        VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
                  ((VulkanCommandBuffer *)&msg,0,VVar11,0x1000,0x1000);
        msg_11._M_dataplus._M_p = (pointer)0x0;
        msg_11._M_string_length = 0;
        msg_11.field_2._M_allocated_capacity = local_248.size;
        VulkanUtilities::VulkanCommandBuffer::CopyBuffer
                  ((VulkanCommandBuffer *)&msg,StagingBuffer.m_VkObject,
                   (this->m_VulkanBuffer).m_VkObject,1,(VkBufferCopy *)&msg_11);
        pRVar12 = local_210;
        RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff
                  (local_210,CmdQueueInd,(VkCommandBuffer)msg._M_dataplus._M_p,&CmdPool);
        RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
        ::
        SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
                  ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                    *)pRVar12,&StagingBuffer,1L << (CmdQueueInd.m_Value & 0x3f));
        RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
        ::SafeReleaseDeviceObject<VulkanUtilities::VulkanMemoryAllocation,void>
                  ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                    *)pRVar12,&StagingMemoryAllocation,1L << (CmdQueueInd.m_Value & 0x3f));
        std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::
        ~_Vector_base(&local_188);
        VulkanUtilities::
        VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
        ~VulkanObjectWrapper(&CmdPool);
        VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation(&StagingMemoryAllocation);
        VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
        ~VulkanObjectWrapper(&StagingBuffer);
        std::__cxx11::string::~string((string *)&StagingBufferName);
        RVar17 = RESOURCE_STATE_COPY_DEST;
      }
      else {
        pvVar3 = ((this->m_MemoryAllocation).Page)->m_CPUMemory;
        if (pvVar3 == (void *)0x0) {
          FormatString<char[26],char[17]>
                    (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x66bdf3,
                     (char (*) [17])this_00);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x15b);
          std::__cxx11::string::~string((string *)&msg);
        }
        memcpy((void *)((long)pvVar3 + *local_168),pBVar6->pData,uVar15);
        if ((uVar9 & 4) == 0) {
          FlushMappedRange(this,0,(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                  .m_Desc.Size);
        }
      }
    }
  }
  (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = RVar17;
LAB_001a4cc7:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_118);
  return;
}

Assistant:

BufferVkImpl::BufferVkImpl(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& BuffViewObjMemAllocator,
                           RenderDeviceVkImpl*        pRenderDeviceVk,
                           const BufferDesc&          BuffDesc,
                           const BufferData*          pBuffData /*= nullptr*/) :
    TBufferBase{
        pRefCounters,
        BuffViewObjMemAllocator,
        pRenderDeviceVk,
        BuffDesc,
        false,
    }
{
    ValidateBufferInitData(m_Desc, pBuffData);

    const VulkanUtilities::VulkanLogicalDevice&  LogicalDevice  = pRenderDeviceVk->GetLogicalDevice();
    const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice = pRenderDeviceVk->GetPhysicalDevice();
    const VkPhysicalDeviceLimits&                DeviceLimits   = PhysicalDevice.GetProperties().limits;

    m_DynamicOffsetAlignment = std::max(Uint32{4}, static_cast<Uint32>(DeviceLimits.optimalBufferCopyOffsetAlignment));

    VkBufferCreateInfo VkBuffCI{};
    VkBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkBuffCI.pNext = nullptr;
    VkBuffCI.flags = 0; // VK_BUFFER_CREATE_SPARSE_BINDING_BIT, VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT, VK_BUFFER_CREATE_SPARSE_ALIASED_BIT
    VkBuffCI.size  = m_Desc.Size;
    VkBuffCI.usage =
        VK_BUFFER_USAGE_TRANSFER_SRC_BIT | // The buffer can be used as the source of a transfer command
        VK_BUFFER_USAGE_TRANSFER_DST_BIT;  // The buffer can be used as the destination of a transfer command

    static_assert(BIND_FLAG_LAST == 0x800, "Please update this function to handle the new bind flags");

    for (BIND_FLAGS BindFlags = m_Desc.BindFlags; BindFlags != 0;)
    {
        BIND_FLAGS BindFlag = ExtractLSB(BindFlags);
        switch (BindFlag)
        {
            case BIND_SHADER_RESOURCE:
            {
                if (m_Desc.Mode == BUFFER_MODE_FORMATTED)
                {
                    // Formatted buffers are mapped to uniform texel buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minTexelBufferOffsetAlignment));
                }
                else
                {
                    // Structured and ByteAddress buffers are mapped to read-only storage buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minStorageBufferOffsetAlignment));
                }

                break;
            }
            case BIND_UNORDERED_ACCESS:
            {
                if (m_Desc.Mode == BUFFER_MODE_FORMATTED)
                {
                    // RW formatted buffers are mapped to storage texel buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minTexelBufferOffsetAlignment));
                }
                else
                {
                    // RWStructured and RWByteAddress buffers are mapped to storage buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
                    // Each element of pDynamicOffsets of vkCmdBindDescriptorSets function which corresponds to a descriptor
                    // binding with type VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC must be a multiple of
                    // VkPhysicalDeviceLimits::minStorageBufferOffsetAlignment (13.2.5)
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minStorageBufferOffsetAlignment));
                }

                break;
            }
            case BIND_VERTEX_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_VERTEX_BUFFER_BIT;
                break;
            }
            case BIND_INDEX_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_INDEX_BUFFER_BIT;
                break;
            }
            case BIND_INDIRECT_DRAW_ARGS:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT;
                break;
            }
            case BIND_UNIFORM_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT;

                // Each element of pDynamicOffsets parameter of vkCmdBindDescriptorSets function which corresponds to a descriptor
                // binding with type VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC must be a multiple of
                // VkPhysicalDeviceLimits::minUniformBufferOffsetAlignment (13.2.5)
                m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minUniformBufferOffsetAlignment));
                break;
            }
            case BIND_RAY_TRACING:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT; // for scratch buffer
                VkBuffCI.usage |= VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
                VkBuffCI.usage |= VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_BUILD_INPUT_READ_ONLY_BIT_KHR; // acceleration structure build inputs such as vertex, index, transform, aabb, and instance data
                VkBuffCI.usage |= VK_BUFFER_USAGE_SHADER_BINDING_TABLE_BIT_KHR;
                break;
            }
            default:
                UNEXPECTED("unsupported buffer binding type");
                break;
        }
    }

    VkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE; // Sharing mode of the buffer when it is accessed by multiple queue families.
    VkBuffCI.queueFamilyIndexCount = 0;                         // The number of entries in the pQueueFamilyIndices array.
    VkBuffCI.pQueueFamilyIndices   = nullptr;                   // The list of queue families that will access this buffer
                                                                // (ignored if sharingMode is not VK_SHARING_MODE_CONCURRENT).

    const std::vector<uint32_t> QueueFamilyIndices = PlatformMisc::CountOneBits(m_Desc.ImmediateContextMask) > 1 ?
        GetDevice()->ConvertCmdQueueIdsToQueueFamilies(m_Desc.ImmediateContextMask) :
        std::vector<uint32_t>{};
    if (QueueFamilyIndices.size() > 1)
    {
        // If sharingMode is VK_SHARING_MODE_CONCURRENT, queueFamilyIndexCount must be greater than 1
        VkBuffCI.sharingMode           = VK_SHARING_MODE_CONCURRENT;
        VkBuffCI.pQueueFamilyIndices   = QueueFamilyIndices.data();
        VkBuffCI.queueFamilyIndexCount = static_cast<uint32_t>(QueueFamilyIndices.size());
    }

    constexpr VkBufferUsageFlags UsageThatRequiresBackingBuffer =
        VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT |
        VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT |
        VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;

    const bool RequiresBackingBuffer =
        (VkBuffCI.usage & UsageThatRequiresBackingBuffer) != 0 ||
        // We only need a backing buffer for the storage buffer if there is an unordered access bind flag (aka RW structured buffers).
        // Read-only storage buffers (aka structured buffers) don't need a backing buffer.
        ((VkBuffCI.usage & VK_BUFFER_USAGE_STORAGE_BUFFER_BIT) != 0 && (m_Desc.BindFlags & BIND_UNORDERED_ACCESS) != 0);

    if (m_Desc.Usage == USAGE_SPARSE)
    {
        VkBuffCI.flags =
            VK_BUFFER_CREATE_SPARSE_BINDING_BIT |
            VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT |
            (m_Desc.MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING ? VK_BUFFER_CREATE_SPARSE_ALIASED_BIT : 0);

        m_VulkanBuffer = LogicalDevice.CreateBuffer(VkBuffCI, m_Desc.Name);

        SetState(RESOURCE_STATE_UNDEFINED);
    }
    else if (m_Desc.Usage == USAGE_DYNAMIC && !RequiresBackingBuffer)
    {
        VERIFY(VkBuffCI.sharingMode == VK_SHARING_MODE_EXCLUSIVE,
               "Sharing mode is not supported for dynamic buffers, must be handled by ValidateBufferDesc()");

        // Dynamic constant/vertex/index/structured buffers are suballocated in the upload heap when Map() is called.
        // Dynamic formatted buffers or writable buffers need to be allocated in GPU-local memory.
        constexpr RESOURCE_STATE State = static_cast<RESOURCE_STATE>(
            RESOURCE_STATE_VERTEX_BUFFER |
            RESOURCE_STATE_INDEX_BUFFER |
            RESOURCE_STATE_CONSTANT_BUFFER |
            RESOURCE_STATE_SHADER_RESOURCE |
            RESOURCE_STATE_COPY_SOURCE |
            RESOURCE_STATE_INDIRECT_ARGUMENT);
        SetState(State);

#ifdef DILIGENT_DEBUG
        {
            constexpr VkAccessFlags AccessFlags =
                VK_ACCESS_INDIRECT_COMMAND_READ_BIT |
                VK_ACCESS_INDEX_READ_BIT |
                VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT |
                VK_ACCESS_UNIFORM_READ_BIT |
                VK_ACCESS_SHADER_READ_BIT |
                VK_ACCESS_TRANSFER_READ_BIT;
            VERIFY_EXPR(ResourceStateFlagsToVkAccessFlags(State) == AccessFlags);
        }
#endif
        // Dynamic buffer memory is always host-coherent
        m_MemoryProperties = MEMORY_PROPERTY_HOST_COHERENT;
    }
    else
    {
        VERIFY(m_Desc.Usage != USAGE_DYNAMIC || PlatformMisc::CountOneBits(m_Desc.ImmediateContextMask) <= 1,
               "ImmediateContextMask must contain single set bit, this error should've been handled in ValidateBufferDesc()");

        m_VulkanBuffer = LogicalDevice.CreateBuffer(VkBuffCI, m_Desc.Name);

        VkMemoryRequirements MemReqs = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);

        static constexpr uint32_t InvalidMemoryTypeIndex = VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex;

        uint32_t MemoryTypeIndex = InvalidMemoryTypeIndex;
        {
            VkMemoryPropertyFlags vkMemoryFlags = 0;
            switch (m_Desc.Usage)
            {
                case USAGE_IMMUTABLE:
                case USAGE_DEFAULT:
                case USAGE_DYNAMIC: // Dynamic buffer with SRV or UAV bind flag
                    vkMemoryFlags = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT;
                    break;

                case USAGE_UNIFIED:
                case USAGE_STAGING:
                    vkMemoryFlags = VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;

                    if (m_Desc.Usage == USAGE_UNIFIED)
                        vkMemoryFlags |= VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT;

                    if ((m_Desc.CPUAccessFlags & CPU_ACCESS_READ) != 0)
                        vkMemoryFlags |= VK_MEMORY_PROPERTY_HOST_CACHED_BIT;

                    // Try to find coherent memory first
                    vkMemoryFlags |= VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
                    MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, vkMemoryFlags);
                    if (MemoryTypeIndex == InvalidMemoryTypeIndex)
                    {
                        // Use non-coherent memory
                        vkMemoryFlags &= ~VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
                    }
                    break;

                default:
                    UNEXPECTED("Unexpected usage");
            }
            if (MemoryTypeIndex == InvalidMemoryTypeIndex)
                MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, vkMemoryFlags);

            if (vkMemoryFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT)
                m_MemoryProperties |= MEMORY_PROPERTY_HOST_COHERENT;
        }

        VkMemoryAllocateFlags AllocateFlags = 0;
        if (VkBuffCI.usage & VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT)
            AllocateFlags = VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT;

        if (MemoryTypeIndex == InvalidMemoryTypeIndex)
            LOG_ERROR_AND_THROW("Failed to find suitable memory type for buffer '", m_Desc.Name, '\'');

        VkDeviceSize RequiredAlignment = MemReqs.alignment;
        if ((m_Desc.BindFlags & BIND_RAY_TRACING) != 0)
        {
            // geometry.triangles.vertexData.deviceAddress must be aligned to the size in bytes of the smallest component of the format in vertexFormat (which is 4 bytes).
            // geometry.triangles.indexData.deviceAddress must be aligned to the size in bytes of the type in indexType (which is 4 bytes).
            // if geometry.triangles.transformData.deviceAddress is not 0, it must be aligned to 16 bytes.
            // geometry.aabbs.data.deviceAddress must be aligned to 8 bytes.
            const VkDeviceSize ReadOnlyRTBufferAlign = 16u;
            const VkDeviceSize ScratchBufferAlign    = PhysicalDevice.GetExtProperties().AccelStruct.minAccelerationStructureScratchOffsetAlignment;
            RequiredAlignment                        = std::max(RequiredAlignment, std::max(ScratchBufferAlign, ReadOnlyRTBufferAlign));
            VERIFY_EXPR(RequiredAlignment % MemReqs.alignment == 0);
        }

        const bool AlignToNonCoherentAtomSize = (m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) != 0 && (m_MemoryProperties & MEMORY_PROPERTY_HOST_COHERENT) == 0;
        if (AlignToNonCoherentAtomSize)
        {
            // From specs:
            //  If the device memory was allocated without the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT set,
            //  these guarantees must be made for an extended range: the application must round down the start
            //  of the range to the nearest multiple of VkPhysicalDeviceLimits::nonCoherentAtomSize,
            //  and round the end of the range up to the nearest multiple of VkPhysicalDeviceLimits::nonCoherentAtomSize.
            RequiredAlignment = std::max(RequiredAlignment, DeviceLimits.nonCoherentAtomSize);
            MemReqs.size      = AlignUp(MemReqs.size, DeviceLimits.nonCoherentAtomSize);
        }

        VERIFY(IsPowerOfTwo(RequiredAlignment), "Alignment is not power of 2!");
        m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, RequiredAlignment, MemoryTypeIndex, AllocateFlags);
        if (!m_MemoryAllocation)
            LOG_ERROR_AND_THROW("Failed to allocate memory for buffer '", m_Desc.Name, "'.");

        m_BufferMemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, RequiredAlignment);
        VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_BufferMemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
        VkDeviceMemory Memory = m_MemoryAllocation.Page->GetVkMemory();
        VkResult       err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_BufferMemoryAlignedOffset);
        CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

        VERIFY(!AlignToNonCoherentAtomSize || (m_BufferMemoryAlignedOffset + MemReqs.size) % DeviceLimits.nonCoherentAtomSize == 0, "End offset is not properly aligned");

#ifdef DILIGENT_DEBUG
        if ((m_Desc.BindFlags & BIND_RAY_TRACING) != 0)
        {
            const VkDeviceSize    ReadOnlyRTBufferAlign = 16u;
            const VkDeviceSize    ScratchBufferAlign    = PhysicalDevice.GetExtProperties().AccelStruct.minAccelerationStructureScratchOffsetAlignment;
            const VkDeviceSize    MinRTBufferAlign      = std::max(ScratchBufferAlign, ReadOnlyRTBufferAlign);
            const VkDeviceAddress DeviceAddress         = GetVkDeviceAddress();
            VERIFY(DeviceAddress % MinRTBufferAlign == 0, "Address is not properly aligned for ray tracing usage");
        }
#endif

        const Uint64 InitialDataSize = (pBuffData != nullptr && pBuffData->pData != nullptr) ?
            std::min(pBuffData->DataSize, VkBuffCI.size) :
            0;

        RESOURCE_STATE InitialState = RESOURCE_STATE_UNDEFINED;
        if (InitialDataSize > 0)
        {
            const VkPhysicalDeviceMemoryProperties& MemoryProps = PhysicalDevice.GetMemoryProperties();
            VERIFY_EXPR(MemoryTypeIndex < MemoryProps.memoryTypeCount);
            const VkMemoryPropertyFlags MemoryPropFlags = MemoryProps.memoryTypes[MemoryTypeIndex].propertyFlags;
            if ((MemoryPropFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) != 0)
            {
                // Memory is directly accessible by CPU
                uint8_t* pData = reinterpret_cast<uint8_t*>(m_MemoryAllocation.Page->GetCPUMemory());
                VERIFY_EXPR(pData != nullptr);
                memcpy(pData + m_BufferMemoryAlignedOffset, pBuffData->pData, StaticCast<size_t>(InitialDataSize));

                if ((MemoryPropFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT) == 0)
                {
                    // Explicit flush is required
                    FlushMappedRange(0, m_Desc.Size);
                }
            }
            else
            {
                VkBufferCreateInfo VkStaginBuffCI = VkBuffCI;
                VkStaginBuffCI.usage              = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;

                std::string StagingBufferName = "Upload buffer for '";
                StagingBufferName += m_Desc.Name;
                StagingBufferName += '\'';
                VulkanUtilities::BufferWrapper StagingBuffer = LogicalDevice.CreateBuffer(VkStaginBuffCI, StagingBufferName.c_str());

                VkMemoryRequirements StagingBufferMemReqs = LogicalDevice.GetBufferMemoryRequirements(StagingBuffer);
                VERIFY(IsPowerOfTwo(StagingBufferMemReqs.alignment), "Alignment is not power of 2!");

                // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
                // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
                // to the host (10.2)
                VulkanUtilities::VulkanMemoryAllocation StagingMemoryAllocation = pRenderDeviceVk->AllocateMemory(StagingBufferMemReqs, VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);
                if (!StagingMemoryAllocation)
                    LOG_ERROR_AND_THROW("Failed to allocate staging memory for buffer '", m_Desc.Name, "'.");

                VkDeviceMemory StagingBufferMemory     = StagingMemoryAllocation.Page->GetVkMemory();
                VkDeviceSize   AlignedStagingMemOffset = AlignUp(VkDeviceSize{StagingMemoryAllocation.UnalignedOffset}, StagingBufferMemReqs.alignment);
                VERIFY_EXPR(StagingMemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - StagingMemoryAllocation.UnalignedOffset));

                uint8_t* StagingData = reinterpret_cast<uint8_t*>(StagingMemoryAllocation.Page->GetCPUMemory());
                if (StagingData == nullptr)
                    LOG_ERROR_AND_THROW("Failed to allocate staging data for buffer '", m_Desc.Name, '\'');
                memcpy(StagingData + AlignedStagingMemOffset, pBuffData->pData, StaticCast<size_t>(InitialDataSize));

                err = LogicalDevice.BindBufferMemory(StagingBuffer, StagingBufferMemory, AlignedStagingMemOffset);
                CHECK_VK_ERROR_AND_THROW(err, "Failed to bind staging buffer memory");

                const SoftwareQueueIndex CmdQueueInd = pBuffData->pContext ?
                    ClassPtrCast<DeviceContextVkImpl>(pBuffData->pContext)->GetCommandQueueId() :
                    SoftwareQueueIndex{PlatformMisc::GetLSB(m_Desc.ImmediateContextMask)};

                VulkanUtilities::CommandPoolWrapper  CmdPool;
                VulkanUtilities::VulkanCommandBuffer CmdBuffer;
                pRenderDeviceVk->AllocateTransientCmdPool(CmdQueueInd, CmdPool, CmdBuffer, "Transient command pool to copy staging data to a device buffer");

                CmdBuffer.MemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT);
                InitialState              = RESOURCE_STATE_COPY_DEST;
                VkAccessFlags AccessFlags = ResourceStateFlagsToVkAccessFlags(InitialState);
                VERIFY_EXPR(AccessFlags == VK_ACCESS_TRANSFER_WRITE_BIT);
                CmdBuffer.MemoryBarrier(0, AccessFlags, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT);

                // Copy commands MUST be recorded outside of a render pass instance. This is OK here
                // as copy will be the only command in the cmd buffer
                VkBufferCopy BuffCopy{};
                BuffCopy.srcOffset = 0;
                BuffCopy.dstOffset = 0;
                BuffCopy.size      = VkBuffCI.size;
                CmdBuffer.CopyBuffer(StagingBuffer, m_VulkanBuffer, 1, &BuffCopy);

                pRenderDeviceVk->ExecuteAndDisposeTransientCmdBuff(CmdQueueInd, CmdBuffer.GetVkCmdBuffer(), std::move(CmdPool));


                // After command buffer is submitted, safe-release staging resources. This strategy
                // is little overconservative as the resources will only be released after the
                // first command buffer submitted through the immediate context is complete

                // Next Cmd Buff| Next Fence |               This Thread                      |           Immediate Context
                //              |            |                                                |
                //      N       |     F      |                                                |
                //              |            |                                                |
                //              |            |  ExecuteAndDisposeTransientCmdBuff(vkCmdBuff)  |
                //              |            |  - SubmittedCmdBuffNumber = N                  |
                //              |            |  - SubmittedFenceValue = F                     |
                //     N+1 -  - | -  F+1  -  |                                                |
                //              |            |  Release(StagingBuffer)                        |
                //              |            |  - {N+1, StagingBuffer} -> Stale Objects       |
                //              |            |                                                |
                //              |            |                                                |
                //              |            |                                                | ExecuteCommandBuffer()
                //              |            |                                                | - SubmittedCmdBuffNumber = N+1
                //              |            |                                                | - SubmittedFenceValue = F+1
                //     N+2 -  - | -  F+2  -  |  -   -   -   -   -   -   -   -   -   -   -   - |
                //              |            |                                                | - DiscardStaleVkObjects(N+1, F+1)
                //              |            |                                                |   - {F+1, StagingBuffer} -> Release Queue
                //              |            |                                                |

                pRenderDeviceVk->SafeReleaseDeviceObject(std::move(StagingBuffer), Uint64{1} << Uint64{CmdQueueInd});
                pRenderDeviceVk->SafeReleaseDeviceObject(std::move(StagingMemoryAllocation), Uint64{1} << Uint64{CmdQueueInd});
            }
        }

        SetState(InitialState);
    }

    VERIFY_EXPR(IsInKnownState());
}